

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O3

bool goodform::convert<unsigned_char>(any *v,uchar *dest)

{
  bool bVar1;
  bool bVar2;
  uchar uVar3;
  unsigned_long *puVar4;
  float *pfVar5;
  double *pdVar6;
  
  bVar1 = can_be<unsigned_char>(v);
  if (!bVar1) {
    return bVar1;
  }
  bVar2 = is<signed_char>(v);
  if (bVar2) {
    puVar4 = (unsigned_long *)get<signed_char>(v);
  }
  else {
    bVar2 = is<short>(v);
    if (bVar2) {
      puVar4 = (unsigned_long *)get<short>(v);
    }
    else {
      bVar2 = is<int>(v);
      if (bVar2) {
        puVar4 = (unsigned_long *)get<int>(v);
      }
      else {
        bVar2 = is<long>(v);
        if (bVar2) {
          puVar4 = (unsigned_long *)get<long>(v);
        }
        else {
          bVar2 = is<unsigned_char>(v);
          if (bVar2) {
            puVar4 = (unsigned_long *)get<unsigned_char>(v);
          }
          else {
            bVar2 = is<unsigned_short>(v);
            if (bVar2) {
              puVar4 = (unsigned_long *)get<unsigned_short>(v);
            }
            else {
              bVar2 = is<unsigned_int>(v);
              if (bVar2) {
                puVar4 = (unsigned_long *)get<unsigned_int>(v);
              }
              else {
                bVar2 = is<unsigned_long>(v);
                if (!bVar2) {
                  bVar2 = is<float>(v);
                  if (bVar2) {
                    pfVar5 = get<float>(v);
                    uVar3 = (uchar)(int)*pfVar5;
                  }
                  else {
                    bVar2 = is<double>(v);
                    if (!bVar2) {
                      return bVar1;
                    }
                    pdVar6 = get<double>(v);
                    uVar3 = (uchar)(int)*pdVar6;
                  }
                  goto LAB_00129ac8;
                }
                puVar4 = get<unsigned_long>(v);
              }
            }
          }
        }
      }
    }
  }
  uVar3 = (uchar)*puVar4;
LAB_00129ac8:
  *dest = uVar3;
  return bVar1;
}

Assistant:

bool convert(const any& v, T& dest)
  {
    if (can_be<T>(v))
    {
      if (is<std::int8_t>(v))        dest = T(get<std::int8_t>(v));
      else if (is<std::int16_t>(v))  dest = T(get<std::int16_t>(v));
      else if (is<std::int32_t>(v))  dest = T(get<std::int32_t>(v));
      else if (is<std::int64_t>(v))  dest = T(get<std::int64_t>(v));
      else if (is<std::uint8_t>(v))  dest = T(get<std::uint8_t>(v));
      else if (is<std::uint16_t>(v)) dest = T(get<std::uint16_t>(v));
      else if (is<std::uint32_t>(v)) dest = T(get<std::uint32_t>(v));
      else if (is<std::uint64_t>(v)) dest = T(get<std::uint64_t>(v));
      else if (is<float>(v))         dest = T(get<float>(v));
      else if (is<double>(v))        dest = T(get<double>(v));
      return true;
    }
    return false;
  }